

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::CopyFrom
          (WordEmbedding *this,WordEmbedding *from)

{
  string *psVar1;
  
  if (from != this) {
    psVar1 = (this->language_).ptr_;
    if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
    psVar1 = (this->modelparameterdata_).ptr_;
    if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
    this->revision_ = 0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void WordEmbedding::CopyFrom(const WordEmbedding& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}